

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,TokenType *token)

{
  ostream *poVar1;
  string tokenString;
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,_ZL10TokenNames_rel + *(int *)(_ZL10TokenNames_rel + (ulong)*token * 4),
             &local_31);
  poVar1 = std::operator<<(stream,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const TokenType &token) {
    string tokenString = TokenNames[token];

    return stream << tokenString;
}